

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<short>::doRenderStreams
          (RendererImpl<short> *this,DACOutputStreams<short> *streams,Bit32u len)

{
  MidiEventQueue *pMVar1;
  Synth *pSVar2;
  MidiEvent *pMVar3;
  uint len_00;
  uint uVar4;
  DACOutputStreams<short> tmpStreams;
  
  tmpStreams.nonReverbLeft = streams->nonReverbLeft;
  tmpStreams.nonReverbRight = streams->nonReverbRight;
  tmpStreams.reverbDryLeft = streams->reverbDryLeft;
  tmpStreams.reverbDryRight = streams->reverbDryRight;
  tmpStreams.reverbWetLeft = streams->reverbWetLeft;
  tmpStreams.reverbWetRight = streams->reverbWetRight;
  do {
    if (len == 0) {
      return;
    }
    pSVar2 = (this->super_Renderer).synth;
    len_00 = 1;
    if (pSVar2->abortingPoly == (Poly *)0x0) {
      pMVar1 = pSVar2->midiQueue;
      uVar4 = 0x1000;
      if (pMVar1->startPosition != pMVar1->endPosition) {
        if (pMVar1->ringBuffer != (MidiEvent *)0x0) {
          pMVar3 = pMVar1->ringBuffer + pMVar1->startPosition;
          uVar4 = pMVar3->timestamp - pSVar2->renderedSampleCount;
          if ((int)uVar4 < 1) {
            if (pMVar3->sysexData == (Bit8u *)0x0) {
              Synth::playMsgNow(pSVar2,(pMVar3->field_1).sysexLength);
              pSVar2 = (this->super_Renderer).synth;
              if (pSVar2->abortingPoly != (Poly *)0x0) goto LAB_001155ed;
            }
            else {
              Synth::playSysexNow(pSVar2,pMVar3->sysexData,(pMVar3->field_1).sysexLength);
              pSVar2 = (this->super_Renderer).synth;
            }
            MidiEventQueue::dropMidiEvent(pSVar2->midiQueue);
            goto LAB_001155ed;
          }
        }
      }
      len_00 = uVar4;
      if (len < uVar4) {
        len_00 = len;
      }
      if (0xfff < len_00) {
        len_00 = 0x1000;
      }
    }
LAB_001155ed:
    produceStreams(this,&tmpStreams,len_00);
    advanceStreams<short>(&tmpStreams,len_00);
    len = len - len_00;
  } while( true );
}

Assistant:

void RendererImpl<Sample>::doRenderStreams(const DACOutputStreams<Sample> &streams, Bit32u len)
{
	DACOutputStreams<Sample> tmpStreams = streams;
	while (len > 0) {
		// We need to ensure zero-duration notes will play so add minimum 1-sample delay.
		Bit32u thisLen = 1;
		if (!isAbortingPoly()) {
			const volatile MidiEventQueue::MidiEvent *nextEvent = getMidiQueue().peekMidiEvent();
			Bit32s samplesToNextEvent = (nextEvent != NULL) ? Bit32s(nextEvent->timestamp - getRenderedSampleCount()) : MAX_SAMPLES_PER_RUN;
			if (samplesToNextEvent > 0) {
				thisLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
				if (thisLen > Bit32u(samplesToNextEvent)) {
					thisLen = samplesToNextEvent;
				}
			} else {
				if (nextEvent->sysexData == NULL) {
					synth.playMsgNow(nextEvent->shortMessageData);
					// If a poly is aborting we don't drop the event from the queue.
					// Instead, we'll return to it again when the abortion is done.
					if (!isAbortingPoly()) {
						getMidiQueue().dropMidiEvent();
					}
				} else {
					synth.playSysexNow(nextEvent->sysexData, nextEvent->sysexLength);
					getMidiQueue().dropMidiEvent();
				}
			}
		}
		produceStreams(tmpStreams, thisLen);
		advanceStreams(tmpStreams, thisLen);
		len -= thisLen;
	}
}